

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QTransform * __thiscall
QGraphicsView::viewportTransform(QTransform *__return_storage_ptr__,QGraphicsView *this)

{
  QGraphicsViewPrivate *this_00;
  long lVar1;
  qreal *pqVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  long in_FS_OFFSET;
  byte bVar5;
  QTransform moveMatrix;
  qreal local_68 [10];
  long local_18;
  
  bVar5 = 0;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pqVar2 = (qreal *)&DAT_00704bf8;
  pqVar3 = local_68;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pqVar3 = *pqVar2;
    pqVar2 = pqVar2 + 1;
    pqVar3 = pqVar3 + 1;
  }
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  lVar1 = this_00->scrollX;
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  QTransform::fromTranslate((double)-lVar1,(double)-this_00->scrollY);
  if ((this_00->field_0x300 & 0x10) == 0) {
    QTransform::operator*(__return_storage_ptr__,&this_00->matrix);
  }
  else {
    pqVar2 = local_68;
    pQVar4 = __return_storage_ptr__;
    for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pQVar4->m_matrix[0][0] = *pqVar2;
      pqVar2 = pqVar2 + (ulong)bVar5 * -2 + 1;
      pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsView::viewportTransform() const
{
    Q_D(const QGraphicsView);
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    return d->identityMatrix ? moveMatrix : d->matrix * moveMatrix;
}